

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int xpath_string_length(lyxp_set **args,uint16_t arg_count,lyd_node *cur_node,lys_module *param_4,
                       lyxp_set *set,int options)

{
  int iVar1;
  int iVar2;
  lys_node *plVar3;
  size_t sVar4;
  char *pcVar5;
  char *format;
  ly_ctx *ctx;
  
  if ((options & 0x1cU) == 0) {
    if (arg_count == 0) {
      iVar2 = lyxp_set_cast(set,LYXP_SET_STRING,cur_node,param_4,options);
      if (iVar2 != 0) {
        return -1;
      }
      sVar4 = strlen((set->val).str);
    }
    else {
      iVar2 = lyxp_set_cast(*args,LYXP_SET_STRING,cur_node,param_4,options);
      if (iVar2 != 0) {
        return -1;
      }
      sVar4 = strlen(((*args)->val).str);
    }
    set_fill_number(set,(longdouble)(long)sVar4 +
                        (longdouble)*(float *)(&DAT_001aede8 + (ulong)((long)sVar4 < 0) * 4));
    return 0;
  }
  if (arg_count == 0) {
    iVar2 = 0;
    if ((set->type != LYXP_SET_SNODE_SET) ||
       (plVar3 = warn_get_snode_in_ctx(set), plVar3 == (lys_node *)0x0)) goto LAB_0017991d;
    if ((plVar3->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
      ctx = param_4->ctx;
      pcVar5 = strnodetype(plVar3->nodetype);
      format = "Argument #0 of %s is a %s node \"%s\".";
    }
    else {
      iVar1 = warn_is_string_type((lys_type *)&plVar3[1].ref);
      if (iVar1 != 0) goto LAB_0017991d;
      ctx = param_4->ctx;
      pcVar5 = plVar3->name;
      format = "Argument #0 of %s is node \"%s\", not of string-type.";
    }
  }
  else {
    iVar2 = 0;
    if (((*args)->type != LYXP_SET_SNODE_SET) ||
       (plVar3 = warn_get_snode_in_ctx(*args), plVar3 == (lys_node *)0x0)) goto LAB_0017991d;
    if ((plVar3->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
      ctx = param_4->ctx;
      pcVar5 = strnodetype(plVar3->nodetype);
      format = "Argument #1 of %s is a %s node \"%s\".";
    }
    else {
      iVar1 = warn_is_string_type((lys_type *)&plVar3[1].ref);
      if (iVar1 != 0) goto LAB_0017991d;
      ctx = param_4->ctx;
      pcVar5 = plVar3->name;
      format = "Argument #1 of %s is node \"%s\", not of string-type.";
    }
  }
  iVar2 = 1;
  ly_log(ctx,LY_LLWRN,LY_SUCCESS,format,"xpath_string_length",pcVar5);
LAB_0017991d:
  set_snode_clear_ctx(set);
  return iVar2;
}

Assistant:

static int
xpath_string_length(struct lyxp_set **args, uint16_t arg_count, struct lyd_node *cur_node, struct lys_module *local_mod,
                    struct lyxp_set *set, int options)
{
    struct lys_node_leaf *sleaf;
    int ret = EXIT_SUCCESS;

    if (options & LYXP_SNODE_ALL) {
        if (arg_count && (args[0]->type == LYXP_SET_SNODE_SET) && (sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(args[0]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(local_mod->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
                ret = EXIT_FAILURE;
            } else if (!warn_is_string_type(&sleaf->type)) {
                LOGWRN(local_mod->ctx, "Argument #1 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
                ret = EXIT_FAILURE;
            }
        }
        if (!arg_count && (set->type == LYXP_SET_SNODE_SET) && (sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(set))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(local_mod->ctx, "Argument #0 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
                ret = EXIT_FAILURE;
            } else if (!warn_is_string_type(&sleaf->type)) {
                LOGWRN(local_mod->ctx, "Argument #0 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
                ret = EXIT_FAILURE;
            }
        }
        set_snode_clear_ctx(set);
        return ret;
    }

    if (arg_count) {
        if (lyxp_set_cast(args[0], LYXP_SET_STRING, cur_node, local_mod, options)) {
            return -1;
        }
        set_fill_number(set, strlen(args[0]->val.str));
    } else {
        if (lyxp_set_cast(set, LYXP_SET_STRING, cur_node, local_mod, options)) {
            return -1;
        }
        set_fill_number(set, strlen(set->val.str));
    }

    return EXIT_SUCCESS;
}